

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrmem.c
# Opt level: O1

int mem_iraf_open(char *filename,int rwmode,int *hdl)

{
  int iVar1;
  char *err_message;
  int status;
  size_t filesize;
  int local_2c;
  size_t local_28;
  
  local_28 = 0;
  local_2c = mem_createmem(0,hdl);
  if (local_2c == 0) {
    local_2c = iraf2mem(filename,memTable[*hdl].memaddrptr,memTable[*hdl].memsizeptr,&local_28,
                        &local_2c);
    iVar1 = *hdl;
    if (local_2c == 0) {
      memTable[iVar1].currentpos = 0;
      memTable[iVar1].fitsfilesize = local_28;
      return 0;
    }
    free(*memTable[iVar1].memaddrptr);
    memTable[iVar1].memaddrptr = (char **)0x0;
    memTable[iVar1].memaddr = (char *)0x0;
    err_message = "failed to convert IRAF file into memory (mem_iraf_open)";
  }
  else {
    err_message = "failed to create empty memory file (mem_iraf_open)";
  }
  ffpmsg(err_message);
  return local_2c;
}

Assistant:

int mem_iraf_open(char *filename, int rwmode, int *hdl)
/*
  This routine creates an empty memory buffer, then calls iraf2mem to
  open the IRAF disk file and convert it to a FITS file in memeory.
*/
{
    int status;
    size_t filesize = 0;

    /* create a memory file with size = 0 for the FITS converted IRAF file */
    status = mem_createmem(filesize, hdl);
    if (status)
    {
        ffpmsg("failed to create empty memory file (mem_iraf_open)");
        return(status);
    }

    /* convert the iraf file into a FITS file in memory */
    status = iraf2mem(filename, memTable[*hdl].memaddrptr,
                      memTable[*hdl].memsizeptr, &filesize, &status);

    if (status)
    {
        mem_close_free(*hdl);   /* free up the memory */
        ffpmsg("failed to convert IRAF file into memory (mem_iraf_open)");
        return(status);
    }

    memTable[*hdl].currentpos = 0;           /* save starting position */
    memTable[*hdl].fitsfilesize=filesize;   /* and initial file size  */

    return(0);
}